

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O2

Int __thiscall
ipx::Crossover::DualRatioTest
          (Crossover *this,Vector *z,IndexedVector *row,int *sign_restrict,double step,
          double feastol)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  Int ii_1;
  Int ii;
  Int jblock;
  anon_class_40_5_babcb12e update_max;
  anon_class_40_5_e4e99143 update_step;
  double max_pivot;
  Int local_a4;
  double local_a0;
  int *local_98;
  anon_class_40_5_babcb12e local_90;
  anon_class_40_5_e4e99143 local_68;
  double local_40;
  double local_38;
  
  local_68.sign_restrict = &local_98;
  local_68.step = &local_a0;
  local_68.feastol = &local_38;
  local_68.jblock = &local_a4;
  local_a4 = -1;
  local_a0 = step;
  local_98 = sign_restrict;
  local_68.z = z;
  local_38 = feastol;
  bVar4 = IndexedVector::sparse(row);
  if (bVar4) {
    piVar3 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(uint)row->nnz_;
    if (row->nnz_ < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = piVar3[uVar6];
      DualRatioTest::anon_class_40_5_e4e99143::operator()
                (&local_68,iVar1,(row->elements_)._M_data[iVar1]);
    }
  }
  else {
    uVar2 = (uint)(row->elements_)._M_size;
    uVar6 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      DualRatioTest::anon_class_40_5_e4e99143::operator()
                (&local_68,(Int)uVar6,(row->elements_)._M_data[uVar6]);
    }
  }
  if (-1 < local_a4) {
    local_a4 = -1;
    local_90.max_pivot = &local_40;
    local_40 = 1e-05;
    local_90.step = &local_a0;
    local_90.sign_restrict = &local_98;
    local_90.jblock = &local_a4;
    local_90.z = z;
    bVar4 = IndexedVector::sparse(row);
    if (bVar4) {
      piVar3 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      uVar5 = (ulong)(uint)row->nnz_;
      if (row->nnz_ < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar1 = piVar3[uVar6];
        DualRatioTest::anon_class_40_5_babcb12e::operator()
                  (&local_90,iVar1,(row->elements_)._M_data[iVar1]);
      }
    }
    else {
      uVar2 = (uint)(row->elements_)._M_size;
      uVar6 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        DualRatioTest::anon_class_40_5_babcb12e::operator()
                  (&local_90,(Int)uVar6,(row->elements_)._M_data[uVar6]);
      }
    }
  }
  return local_a4;
}

Assistant:

Int Crossover::DualRatioTest(const Vector& z, const IndexedVector& row,
                             const int sign_restrict[], double step,
                             double feastol) {
    Int jblock = -1;            // return value

    // First pass: determine maximum step size exploiting feasibility tol.
    auto update_step = [&](Int j, double pivot) {
        if (std::abs(pivot) > kPivotZeroTol) {
            if ((sign_restrict[j] & 1) && z[j]-step*pivot < -feastol) {
                step = (z[j]+feastol) / pivot;
                jblock = j;
                assert(z[j] >= 0.0);
                assert(step*pivot > 0.0);
            }
            if ((sign_restrict[j] & 2) && z[j]-step*pivot > feastol) {
                step = (z[j]-feastol) / pivot;
                jblock = j;
                assert(z[j] <= 0.0);
                assert(step*pivot < 0.0);
            }
        }
    };
    for_each_nonzero(row, update_step);

    // If step was not block, we are done.
    if (jblock < 0)
        return jblock;

    // Second pass: choose maximum pivot among all that block within step.
    jblock = -1;
    double max_pivot = kPivotZeroTol;
    auto update_max = [&](Int j, double pivot) {
        if (std::abs(pivot) > max_pivot &&
            std::abs(z[j]/pivot) <= std::abs(step)) {
            if ((sign_restrict[j] & 1) && step*pivot > 0.0) {
                jblock = j;
                max_pivot = std::abs(pivot);
            }
            if ((sign_restrict[j] & 2) && step*pivot < 0.0) {
                jblock = j;
                max_pivot = std::abs(pivot);
            }
        }
    };
    for_each_nonzero(row, update_max);
    assert(jblock >= 0);
    return jblock;
}